

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O0

SPxId __thiscall
soplex::SPxSteepPR<double>::selectEnterSparseCoDim(SPxSteepPR<double> *this,double *best,double tol)

{
  int n;
  double *pdVar1;
  double *pdVar2;
  char *pcVar3;
  int *piVar4;
  int extraout_EDX;
  int __c;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  double *in_RSI;
  long in_RDI;
  double in_XMM0_Qa;
  double dVar5;
  int i;
  double x;
  int idx;
  double *weights_ptr;
  double *test;
  SPxId enterId;
  uint local_44;
  undefined4 in_stack_ffffffffffffffc8;
  DataKey local_8;
  
  SPxId::SPxId((SPxId *)0x2afb47);
  SPxSolverBase<double>::test(*(SPxSolverBase<double> **)(in_RDI + 0x10));
  pdVar1 = VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2afb5c);
  pdVar2 = VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2afb78);
  local_44 = IdxSet::size((IdxSet *)(*(long *)(in_RDI + 0x10) + 0x808));
  __c = extraout_EDX;
  while (local_44 = local_44 - 1, -1 < (int)local_44) {
    pcVar3 = IdxSet::index((IdxSet *)(*(long *)(in_RDI + 0x10) + 0x808),(char *)(ulong)local_44,__c)
    ;
    n = (int)pcVar3;
    if (-in_XMM0_Qa <= pdVar1[n]) {
      IdxSet::remove((IdxSet *)(*(long *)(in_RDI + 0x10) + 0x808),(char *)(ulong)local_44);
      piVar4 = DataArray<int>::operator[]((DataArray<int> *)(*(long *)(in_RDI + 0x10) + 0x880),n);
      *piVar4 = 0;
      __c = extraout_EDX_02;
    }
    else {
      dVar5 = steeppr::computePrice<double>(pdVar1[n],pdVar2[n],in_XMM0_Qa);
      __c = extraout_EDX_00;
      if (*in_RSI <= dVar5 && dVar5 != *in_RSI) {
        *in_RSI = dVar5;
        local_8 = (DataKey)SPxSolverBase<double>::id
                                     ((SPxSolverBase<double> *)CONCAT44(n,in_stack_ffffffffffffffc8)
                                      ,(int)((ulong)dVar5 >> 0x20));
        __c = extraout_EDX_01;
      }
    }
  }
  return (SPxId)local_8;
}

Assistant:

SPxId SPxSteepPR<R>::selectEnterSparseCoDim(R& best, R tol)
{
   SPxId enterId;
   const R* test          = this->thesolver->test().get_const_ptr();
   const R* weights_ptr   = this->thesolver->weights.get_const_ptr();

   int idx;
   R x;

   for(int i = this->thesolver->infeasibilitiesCo.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->infeasibilitiesCo.index(i);
      x = test[idx];

      if(x < -tol)
      {
         x = steeppr::computePrice(x, weights_ptr[idx], tol);

         if(x > best)
         {
            best   = x;
            enterId = this->thesolver->id(idx);
         }
      }
      else
      {
         this->thesolver->infeasibilitiesCo.remove(i);
         this->thesolver->isInfeasibleCo[idx] = this->NOT_VIOLATED;
      }
   }

   return enterId;
}